

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>::templated_iterator<const_slang::ast::Definition_*>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<slang::ast::Definition_const*,slang::ast::Definition_const*,slang::Hasher<slang::ast::Definition_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Definition_const*>>,std::equal_to<slang::ast::Definition_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Definition_const*>>,std::allocator<slang::ast::Definition_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Definition_const*>>>
::emplace_new_key<slang::ast::Definition_const*>
          (sherwood_v3_table<slang::ast::Definition_const*,slang::ast::Definition_const*,slang::Hasher<slang::ast::Definition_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Definition_const*>>,std::equal_to<slang::ast::Definition_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Definition_const*>>,std::allocator<slang::ast::Definition_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Definition_const*>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,Definition **key)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>::templated_iterator<const_slang::ast::Definition_*>,_bool>
  pVar6;
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>::templated_iterator<const_slang::ast::Definition_*>,_bool>
  pVar7;
  bool local_69;
  templated_iterator<const_slang::ast::Definition_*> local_68;
  iterator result;
  value_type to_insert;
  templated_iterator<const_slang::ast::Definition_*> local_50 [3];
  Definition **local_38;
  Definition **key_local;
  EntryPointer current_entry_local;
  sherwood_v3_table<slang::ast::Definition_const*,slang::ast::Definition_const*,slang::Hasher<slang::ast::Definition_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Definition_const*>>,std::equal_to<slang::ast::Definition_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Definition_const*>>,std::allocator<slang::ast::Definition_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Definition_const*>>>
  *psStack_20;
  int8_t distance_from_desired_local;
  sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>
  *this_local;
  bool local_10;
  
  local_38 = key;
  key_local = (Definition **)current_entry;
  current_entry_local._7_1_ =
       (sherwood_v3_table<slang::ast::Definition_const*,slang::ast::Definition_const*,slang::Hasher<slang::ast::Definition_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Definition_const*>>,std::equal_to<slang::ast::Definition_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Definition_const*>>,std::allocator<slang::ast::Definition_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Definition_const*>>>
        )distance_from_desired;
  psStack_20 = this;
  if ((*(long *)(this + 8) != 0) &&
     ((sherwood_v3_table<slang::ast::Definition_const*,slang::ast::Definition_const*,slang::Hasher<slang::ast::Definition_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Definition_const*>>,std::equal_to<slang::ast::Definition_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Definition_const*>>,std::allocator<slang::ast::Definition_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Definition_const*>>>
       )distance_from_desired != this[0x11])) {
    lVar3 = *(long *)(this + 0x18) + 1;
    auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = 0x45300000;
    lVar2 = *(long *)(this + 8) + 1;
    auVar5._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar5._0_8_ = lVar2;
    auVar5._12_4_ = 0x45300000;
    if ((auVar4._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) <=
        ((auVar5._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) *
        (double)*(float *)(this + 0x14)) {
      bVar1 = sherwood_v3_entry<const_slang::ast::Definition_*>::is_empty(current_entry);
      if (bVar1) {
        sherwood_v3_entry<slang::ast::Definition_const*>::emplace<slang::ast::Definition_const*>
                  ((sherwood_v3_entry<slang::ast::Definition_const*> *)key_local,
                   (int8_t)current_entry_local._7_1_,local_38);
        *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
        sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>
        ::templated_iterator<const_slang::ast::Definition_*>::templated_iterator
                  (local_50,(EntryPointer)key_local);
        to_insert._7_1_ = 1;
        std::
        pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>::templated_iterator<const_slang::ast::Definition_*>,_bool>
        ::pair<bool,_true>((pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>::templated_iterator<const_slang::ast::Definition_*>,_bool>
                            *)&this_local,local_50,(bool *)((long)&to_insert + 7));
        pVar6._8_8_ = extraout_RDX;
        pVar6.first.current = (EntryPointer)this_local;
      }
      else {
        result.current = (EntryPointer)*local_38;
        std::swap<signed_char>((char *)((long)&current_entry_local + 7),(char *)key_local);
        std::swap<slang::ast::Definition_const*>((Definition **)&result,key_local + 1);
        sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>
        ::templated_iterator<const_slang::ast::Definition_*>::templated_iterator
                  (&local_68,(EntryPointer)key_local);
        current_entry_local._7_1_ =
             (sherwood_v3_table<slang::ast::Definition_const*,slang::ast::Definition_const*,slang::Hasher<slang::ast::Definition_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Definition_const*>>,std::equal_to<slang::ast::Definition_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Definition_const*>>,std::allocator<slang::ast::Definition_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Definition_const*>>>
              )((char)current_entry_local._7_1_ + '\x01');
        do {
          while( true ) {
            key_local = key_local + 2;
            bVar1 = sherwood_v3_entry<const_slang::ast::Definition_*>::is_empty
                              ((sherwood_v3_entry<const_slang::ast::Definition_*> *)key_local);
            if (bVar1) {
              sherwood_v3_entry<slang::ast::Definition_const*>::
              emplace<slang::ast::Definition_const*>
                        ((sherwood_v3_entry<slang::ast::Definition_const*> *)key_local,
                         (int8_t)current_entry_local._7_1_,(Definition **)&result);
              *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
              local_69 = true;
              std::
              pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>::templated_iterator<const_slang::ast::Definition_*>,_bool>
              ::
              pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>::templated_iterator<const_slang::ast::Definition_*>_&,_bool,_true>
                        ((pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>::templated_iterator<const_slang::ast::Definition_*>,_bool>
                          *)&this_local,&local_68,&local_69);
              pVar6._8_8_ = extraout_RDX_00;
              pVar6.first.current = (EntryPointer)this_local;
              goto LAB_0038d58d;
            }
            if ((char)current_entry_local._7_1_ <= *(char *)key_local) break;
            std::swap<signed_char>((char *)((long)&current_entry_local + 7),(char *)key_local);
            std::swap<slang::ast::Definition_const*>((Definition **)&result,key_local + 1);
            current_entry_local._7_1_ =
                 (sherwood_v3_table<slang::ast::Definition_const*,slang::ast::Definition_const*,slang::Hasher<slang::ast::Definition_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Definition_const*>>,std::equal_to<slang::ast::Definition_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Definition_const*>>,std::allocator<slang::ast::Definition_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Definition_const*>>>
                  )((char)current_entry_local._7_1_ + '\x01');
          }
          current_entry_local._7_1_ =
               (sherwood_v3_table<slang::ast::Definition_const*,slang::ast::Definition_const*,slang::Hasher<slang::ast::Definition_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Definition_const*>>,std::equal_to<slang::ast::Definition_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Definition_const*>>,std::allocator<slang::ast::Definition_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Definition_const*>>>
                )((char)current_entry_local._7_1_ + '\x01');
        } while (current_entry_local._7_1_ != this[0x11]);
        std::swap<slang::ast::Definition_const*>
                  ((Definition **)&result,&((local_68.current)->field_1).value);
        sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>
        ::grow((sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>
                *)this);
        pVar6 = emplace<slang::ast::Definition_const*>(this,(Definition **)&result);
        local_10 = pVar6.second;
      }
      goto LAB_0038d58d;
    }
  }
  sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>
  ::grow((sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>
          *)this);
  pVar6 = emplace<slang::ast::Definition_const*>(this,local_38);
  local_10 = pVar6.second;
LAB_0038d58d:
  this_local = (sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>
                *)pVar6.first.current;
  pVar7._9_7_ = pVar6._9_7_;
  pVar7.second = local_10;
  pVar7.first.current = (EntryPointer)this_local;
  return pVar7;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }